

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_CreateIntArray(int *numbers,int count)

{
  int iVar1;
  cJSON *item;
  cJSON *pcVar2;
  ulong uVar3;
  cJSON *pcVar4;
  
  if ((numbers == (int *)0x0 || count < 0) ||
     (item = (cJSON *)(*global_hooks.allocate)(0x40), item == (cJSON *)0x0)) {
LAB_001081a7:
    item = (cJSON *)0x0;
  }
  else {
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    item->type = 0x20;
    if (count != 0) {
      uVar3 = 0;
      pcVar4 = (cJSON *)0x0;
      do {
        iVar1 = numbers[uVar3];
        pcVar2 = (cJSON *)(*global_hooks.allocate)(0x40);
        if (pcVar2 == (cJSON *)0x0) {
          cJSON_Delete(item);
          goto LAB_001081a7;
        }
        pcVar2->child = (cJSON *)0x0;
        *(undefined8 *)&pcVar2->type = 0;
        pcVar2->valuedouble = 0.0;
        pcVar2->string = (char *)0x0;
        pcVar2->valuestring = (char *)0x0;
        *(undefined8 *)&pcVar2->valueint = 0;
        pcVar2->next = (cJSON *)0x0;
        pcVar2->prev = (cJSON *)0x0;
        pcVar2->type = 8;
        pcVar2->valuedouble = (double)iVar1;
        pcVar2->valueint = iVar1;
        if (uVar3 == 0) {
          item->child = pcVar2;
        }
        else {
          pcVar4->next = pcVar2;
          pcVar2->prev = pcVar4;
        }
        uVar3 = uVar3 + 1;
        pcVar4 = pcVar2;
      } while (uVar3 < (uint)count);
    }
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateIntArray(const int *numbers, int count)
{
    size_t i = 0;
    cJSON *n = NULL;
    cJSON *p = NULL;
    cJSON *a = NULL;

    if ((count < 0) || (numbers == NULL))
    {
        return NULL;
    }

    a = cJSON_CreateArray();
    for(i = 0; a && (i < (size_t)count); i++)
    {
        n = cJSON_CreateNumber(numbers[i]);
        if (!n)
        {
            cJSON_Delete(a);
            return NULL;
        }
        if(!i)
        {
            a->child = n;
        }
        else
        {
            suffix_object(p, n);
        }
        p = n;
    }

    return a;
}